

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventFilter.hpp
# Opt level: O0

void __thiscall binlog::EventFilter::EventFilter(EventFilter *this,Predicate *isAllowed)

{
  function<bool_(const_binlog::EventSource_&)> *in_RSI;
  function<bool_(const_binlog::EventSource_&)> *in_RDI;
  
  std::function<bool_(const_binlog::EventSource_&)>::function(in_RSI,in_RDI);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             0x25ea49);
  return;
}

Assistant:

inline EventFilter::EventFilter(Predicate isAllowed)
  :_isAllowed(std::move(isAllowed))
{}